

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellReissner.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElasticityReissnerIsothropic::ChElasticityReissnerIsothropic
          (ChElasticityReissnerIsothropic *this,double E,double nu,double alpha,double beta)

{
  (this->super_ChElasticityReissner).section = (ChMaterialShellReissner *)0x0;
  (this->super_ChElasticityReissner)._vptr_ChElasticityReissner =
       (_func_int **)&PTR__ChElasticityReissner_00b2b948;
  this->m_E = E;
  this->m_nu = nu;
  this->m_alpha = alpha;
  this->m_beta = beta;
  return;
}

Assistant:

ChElasticityReissnerIsothropic::ChElasticityReissnerIsothropic(      double E,
                                                                     double nu,
                                                                     double alpha,
                                                                     double beta) {
    m_E = E;
    m_nu = nu;
    m_alpha = alpha;
    m_beta = beta;
}